

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

bool __thiscall Gluco::SimpSolver::asymmVar(SimpSolver *this,Var v)

{
  bool bVar1;
  vec<unsigned_int> *pvVar2;
  int i;
  long lVar3;
  lbool local_1d;
  Var v_local;
  
  v_local = v;
  if (this->use_simplification == false) {
    __assert_fail("use_simplification",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x1be,"bool Gluco::SimpSolver::asymmVar(Var)");
  }
  pvVar2 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                     (&this->occurs,&v_local);
  local_1d.value = (this->super_Solver).assigns.data[v_local].value;
  bVar1 = lbool::operator!=(&local_1d,(lbool)0x2);
  if ((bVar1) || (pvVar2->sz == 0)) {
    bVar1 = true;
  }
  else {
    lVar3 = 0;
    do {
      if (pvVar2->sz <= lVar3) {
        bVar1 = backwardSubsumptionCheck(this,false);
        return bVar1;
      }
      bVar1 = asymm(this,v_local,pvVar2->data[lVar3]);
      lVar3 = lVar3 + 1;
    } while (bVar1);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SimpSolver::asymmVar(Var v)
{
    assert(use_simplification);

    const vec<CRef>& cls = occurs.lookup(v);

    if (value(v) != l_Undef || cls.size() == 0)
        return true;

    for (int i = 0; i < cls.size(); i++)
        if (!asymm(v, cls[i]))
            return false;

    return backwardSubsumptionCheck();
}